

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

bool __thiscall
VmaBlockBufferImageGranularity::FinishValidation
          (VmaBlockBufferImageGranularity *this,ValidationContext *ctx)

{
  bool bVar1;
  unsigned_short *in_RSI;
  VkAllocationCallbacks *in_RDI;
  uint32_t page;
  undefined4 in_stack_ffffffffffffffe0;
  uint uVar2;
  VkAllocationCallbacks *pAllocationCallbacks;
  
  pAllocationCallbacks = in_RDI;
  bVar1 = IsEnabled((VmaBlockBufferImageGranularity *)in_RDI);
  if (bVar1) {
    for (uVar2 = 0; uVar2 < *(uint *)&in_RDI->pfnAllocation; uVar2 = uVar2 + 1) {
      if (*(uint16_t *)(*(long *)(in_RSI + 4) + (ulong)uVar2 * 2) !=
          ((RegionInfo *)in_RDI->pfnReallocation)[uVar2].allocCount) {
        return false;
      }
    }
    vma_delete_array<unsigned_short>
              (pAllocationCallbacks,in_RSI,CONCAT44(uVar2,in_stack_ffffffffffffffe0));
    in_RSI[4] = 0;
    in_RSI[5] = 0;
    in_RSI[6] = 0;
    in_RSI[7] = 0;
  }
  return true;
}

Assistant:

bool VmaBlockBufferImageGranularity::FinishValidation(ValidationContext& ctx) const
{
    // Check proper page structure
    if (IsEnabled())
    {
        VMA_ASSERT(ctx.pageAllocs != VMA_NULL && "Validation context not initialized!");

        for (uint32_t page = 0; page < m_RegionCount; ++page)
        {
            VMA_VALIDATE(ctx.pageAllocs[page] == m_RegionInfo[page].allocCount);
        }
        vma_delete_array(ctx.allocCallbacks, ctx.pageAllocs, m_RegionCount);
        ctx.pageAllocs = VMA_NULL;
    }
    return true;
}